

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O0

void rgb24_yuv420_std(uint32_t width,uint32_t height,uint8_t *RGB,uint32_t RGB_stride,uint8_t *Y,
                     uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  RGB2YUVParam *pRVar13;
  ulong uVar14;
  int16_t v_tmp;
  int16_t u_tmp;
  uint8_t *puStack_70;
  uint8_t y_tmp;
  uint8_t *v_ptr;
  uint8_t *u_ptr;
  uint8_t *y_ptr2;
  uint8_t *y_ptr1;
  uint8_t *rgb_ptr2;
  uint8_t *rgb_ptr1;
  uint32_t y;
  uint32_t x;
  RGB2YUVParam *param;
  uint8_t *U_local;
  uint8_t *Y_local;
  uint32_t RGB_stride_local;
  uint8_t *RGB_local;
  uint32_t height_local;
  uint32_t width_local;
  
  uVar14 = (ulong)yuv_type;
  pRVar13 = RGB2YUV + uVar14;
  for (rgb_ptr1._0_4_ = 0; (uint)rgb_ptr1 < height - 1; rgb_ptr1._0_4_ = (uint)rgb_ptr1 + 2) {
    rgb_ptr2 = RGB + (uint)rgb_ptr1 * RGB_stride;
    y_ptr1 = RGB + ((uint)rgb_ptr1 + 1) * RGB_stride;
    y_ptr2 = Y + (uint)rgb_ptr1 * Y_stride;
    u_ptr = Y + ((uint)rgb_ptr1 + 1) * Y_stride;
    v_ptr = U + ((uint)rgb_ptr1 >> 1) * UV_stride;
    puStack_70 = V + ((uint)rgb_ptr1 >> 1) * UV_stride;
    for (rgb_ptr1._4_4_ = 0; rgb_ptr1._4_4_ < width - 1; rgb_ptr1._4_4_ = rgb_ptr1._4_4_ + 2) {
      bVar9 = (byte)((uint)pRVar13->r_factor * (uint)*rgb_ptr2 +
                     (uint)RGB2YUV[uVar14].g_factor * (uint)rgb_ptr2[1] +
                     (uint)RGB2YUV[uVar14].b_factor * (uint)rgb_ptr2[2] >> 8);
      bVar1 = rgb_ptr2[2];
      bVar2 = *rgb_ptr2;
      *y_ptr2 = (char)((int)((uint)bVar9 * (uint)RGB2YUV[uVar14].y_factor) >> 7) +
                RGB2YUV[uVar14].y_offset;
      bVar10 = (byte)((uint)pRVar13->r_factor * (uint)rgb_ptr2[3] +
                      (uint)RGB2YUV[uVar14].g_factor * (uint)rgb_ptr2[4] +
                      (uint)RGB2YUV[uVar14].b_factor * (uint)rgb_ptr2[5] >> 8);
      bVar3 = rgb_ptr2[5];
      bVar4 = rgb_ptr2[3];
      y_ptr2[1] = (char)((int)((uint)bVar10 * (uint)RGB2YUV[uVar14].y_factor) >> 7) +
                  RGB2YUV[uVar14].y_offset;
      bVar11 = (byte)((uint)pRVar13->r_factor * (uint)*y_ptr1 +
                      (uint)RGB2YUV[uVar14].g_factor * (uint)y_ptr1[1] +
                      (uint)RGB2YUV[uVar14].b_factor * (uint)y_ptr1[2] >> 8);
      bVar5 = y_ptr1[2];
      bVar6 = *y_ptr1;
      *u_ptr = (char)((int)((uint)bVar11 * (uint)RGB2YUV[uVar14].y_factor) >> 7) +
               RGB2YUV[uVar14].y_offset;
      bVar12 = (byte)((uint)pRVar13->r_factor * (uint)y_ptr1[3] +
                      (uint)RGB2YUV[uVar14].g_factor * (uint)y_ptr1[4] +
                      (uint)RGB2YUV[uVar14].b_factor * (uint)y_ptr1[5] >> 8);
      bVar7 = y_ptr1[5];
      bVar8 = y_ptr1[3];
      u_ptr[1] = (char)((int)((uint)bVar12 * (uint)RGB2YUV[uVar14].y_factor) >> 7) +
                 RGB2YUV[uVar14].y_offset;
      *v_ptr = (char)(((int)(short)(((ushort)bVar1 - (ushort)bVar9) +
                                    ((ushort)bVar3 - (ushort)bVar10) +
                                    ((ushort)bVar5 - (ushort)bVar11) +
                                   ((ushort)bVar7 - (ushort)bVar12)) >> 2) *
                      (uint)RGB2YUV[uVar14].cb_factor >> 8) + 0x80;
      *puStack_70 = (char)(((int)(short)(((ushort)bVar2 - (ushort)bVar9) +
                                         ((ushort)bVar4 - (ushort)bVar10) +
                                         ((ushort)bVar6 - (ushort)bVar11) +
                                        ((ushort)bVar8 - (ushort)bVar12)) >> 2) *
                           (uint)RGB2YUV[uVar14].cr_factor >> 8) + 0x80;
      rgb_ptr2 = rgb_ptr2 + 6;
      y_ptr1 = y_ptr1 + 6;
      y_ptr2 = y_ptr2 + 2;
      u_ptr = u_ptr + 2;
      v_ptr = v_ptr + 1;
      puStack_70 = puStack_70 + 1;
    }
  }
  return;
}

Assistant:

void rgb24_yuv420_std(
	uint32_t width, uint32_t height, 
	const uint8_t *RGB, uint32_t RGB_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-1); x+=2)
		{
			// compute yuv for the four pixels, u and v values are summed
			uint8_t y_tmp;
			int16_t u_tmp, v_tmp;
			
			y_tmp = (param->r_factor*rgb_ptr1[0] + param->g_factor*rgb_ptr1[1] + param->b_factor*rgb_ptr1[2])>>8;
			u_tmp = rgb_ptr1[2]-y_tmp;
			v_tmp = rgb_ptr1[0]-y_tmp;
			y_ptr1[0]=((y_tmp*param->y_factor)>>7) + param->y_offset;
			
			y_tmp = (param->r_factor*rgb_ptr1[3] + param->g_factor*rgb_ptr1[4] + param->b_factor*rgb_ptr1[5])>>8;
			u_tmp += rgb_ptr1[5]-y_tmp;
			v_tmp += rgb_ptr1[3]-y_tmp;
			y_ptr1[1]=((y_tmp*param->y_factor)>>7) + param->y_offset;

			y_tmp = (param->r_factor*rgb_ptr2[0] + param->g_factor*rgb_ptr2[1] + param->b_factor*rgb_ptr2[2])>>8;
			u_tmp += rgb_ptr2[2]-y_tmp;
			v_tmp += rgb_ptr2[0]-y_tmp;
			y_ptr2[0]=((y_tmp*param->y_factor)>>7) + param->y_offset;
			
			y_tmp = (param->r_factor*rgb_ptr2[3] + param->g_factor*rgb_ptr2[4] + param->b_factor*rgb_ptr2[5])>>8;
			u_tmp += rgb_ptr2[5]-y_tmp;
			v_tmp += rgb_ptr2[3]-y_tmp;
			y_ptr2[1]=((y_tmp*param->y_factor)>>7) + param->y_offset;

			u_ptr[0] = (((u_tmp>>2)*param->cb_factor)>>8) + 128;
			v_ptr[0] = (((v_tmp>>2)*param->cr_factor)>>8) + 128;
			
			rgb_ptr1 += 6;
			rgb_ptr2 += 6;
			y_ptr1 += 2;
			y_ptr2 += 2;
			u_ptr += 1;
			v_ptr += 1;
		}
	}
}